

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmMakefile *this_00;
  cmState *this_01;
  string *psVar4;
  string local_f0;
  undefined1 local_d0 [8];
  cmListFileContext lfc;
  pair<cmTarget::TLLSignature,_cmListFileContext> *cmd;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  *__range1;
  undefined1 local_50 [8];
  cmStateDirectory cmDir;
  char *sigString;
  TLLSignature sig_local;
  ostream *s_local;
  cmTarget *this_local;
  
  pcVar2 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar2 = "keyword";
  }
  cmDir.Snapshot_.Position.Position = (PositionType)pcVar2;
  poVar3 = std::operator<<(s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,(char *)cmDir.Snapshot_.Position.Position);
  std::operator<<(poVar3," signature are here:\n");
  this_00 = GetMakefile(this);
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&__range1,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_50,(cmStateSnapshot *)&__range1);
  __end1 = std::
           vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ::begin(&this->TLLCommands);
  cmd = (pair<cmTarget::TLLSignature,_cmListFileContext> *)
        std::
        vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
        ::end(&this->TLLCommands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                                *)&cmd);
    if (!bVar1) break;
    lfc.Line = (long)__gnu_cxx::
                     __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                     ::operator*(&__end1);
    if (((reference)lfc.Line)->first == sig) {
      cmListFileContext::cmListFileContext
                ((cmListFileContext *)local_d0,&((reference)lfc.Line)->second);
      this_01 = cmMakefile::GetState(this->Makefile);
      psVar4 = cmState::GetSourceDirectory_abi_cxx11_(this_01);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_f0,(cmStateDirectory *)local_50,psVar4,
                 (string *)((long)&lfc.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      poVar3 = std::operator<<(s," * ");
      poVar3 = ::operator<<(poVar3,(cmListFileContext *)local_d0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_d0);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  cmStateDirectory cmDir =
    this->GetMakefile()->GetStateSnapshot().GetDirectory();
  for (auto const& cmd : this->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmDir.ConvertToRelPathIfNotContained(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}